

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

RK_S32 mpi_dec_opt_f(void *ctx,char *next)

{
  MPP_RET MVar1;
  long number;
  ulong local_10;
  
  if (next != (char *)0x0) {
    local_10 = 0;
    MVar1 = str_to_frm_fmt(next,(long *)&local_10);
    if (MVar1 == MPP_OK) {
      if (((local_10 & 0xf0000) == 0 && ((uint)local_10 & 0xfffc) < 0x14) ||
         (((uint)local_10 & 0x1fff0) < 0x10010 && ((uint)local_10 & 0xf0000) == 0x10000)) {
        *(uint *)((long)ctx + 0x204) = (uint)local_10;
        return 1;
      }
      _mpp_log_l(2,"mpi_dec_utils","invalid input format 0x%x\n",0);
    }
  }
  *(undefined4 *)((long)ctx + 0x204) = 0;
  return 0;
}

Assistant:

RK_S32 mpi_dec_opt_f(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        long number = 0;
        MppFrameFormat format = MPP_FMT_BUTT;

        if (MPP_OK == str_to_frm_fmt(next, &number)) {
            format = (MppFrameFormat)number;

            if (MPP_FRAME_FMT_IS_YUV(format) || MPP_FRAME_FMT_IS_RGB(format)) {
                cmd->format = format;
                return 1;
            }

            mpp_err("invalid input format 0x%x\n", format);
        }
    }

    cmd->format = MPP_FMT_YUV420SP;
    return 0;
}